

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::HelperInvocationDerivateCase::
~HelperInvocationDerivateCase(HelperInvocationDerivateCase *this)

{
  HelperInvocationDerivateCase *this_local;
  
  ~HelperInvocationDerivateCase(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

HelperInvocationDerivateCase::~HelperInvocationDerivateCase (void)
{
	deinit();
}